

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

void ffgerr(int status,char *errtext)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  
  *errtext = '\0';
  if (299 < (uint)status) {
    if (599 < status) goto switchD_0017aeb1_caseD_66;
    switch(status) {
    case 0x12d:
      builtin_strncpy(errtext,"illegal HDU number",0x13);
      return;
    case 0x12e:
      builtin_strncpy(errtext + 0xf," 1 or > tfields",0x10);
      uVar3._0_1_ = 'c';
      uVar3._1_1_ = 'o';
      uVar3._2_1_ = 'l';
      uVar3._3_1_ = 'u';
      uVar5._0_1_ = 'm';
      uVar5._1_1_ = 'n';
      uVar5._2_1_ = ' ';
      uVar5._3_1_ = 'n';
      uVar8._0_1_ = 'u';
      uVar8._1_1_ = 'm';
      uVar8._2_1_ = 'b';
      uVar8._3_1_ = 'e';
      uVar10._0_1_ = 'r';
      uVar10._1_1_ = ' ';
      uVar10._2_1_ = '<';
      uVar10._3_1_ = ' ';
      break;
    case 0x12f:
    case 0x131:
    case 0x139:
    case 0x13b:
    case 0x13c:
    case 0x13e:
    case 0x13f:
    case 0x144:
    case 0x145:
    case 0x146:
    case 0x147:
    case 0x148:
    case 0x149:
    case 0x14a:
    case 0x14b:
    case 0x14c:
    case 0x14d:
    case 0x14e:
    case 0x14f:
    case 0x150:
    case 0x151:
    case 0x152:
    case 0x153:
    case 0x15d:
    case 0x15e:
    case 0x15f:
    case 0x160:
    case 0x161:
    case 0x162:
    case 0x163:
    case 0x164:
    case 0x165:
    case 0x166:
    case 0x167:
    case 0x172:
    case 0x173:
    case 0x174:
    case 0x175:
    case 0x176:
    case 0x177:
    case 0x178:
    case 0x179:
    case 0x17a:
    case 0x17b:
    case 0x17c:
    case 0x17d:
    case 0x17e:
    case 0x17f:
    case 0x180:
    case 0x181:
    case 0x182:
    case 0x183:
    case 0x184:
    case 0x185:
    case 0x186:
    case 0x187:
    case 0x188:
    case 0x189:
    case 0x18a:
    case 0x18b:
    case 0x18c:
    case 0x18d:
    case 0x18e:
    case 399:
    case 400:
    case 0x19f:
    case 0x1a0:
    case 0x1a1:
    case 0x1a2:
    case 0x1a3:
    case 0x1a5:
    case 0x1a6:
    case 0x1a7:
    case 0x1a8:
    case 0x1a9:
    case 0x1aa:
    case 0x1ab:
    case 0x1ac:
    case 0x1ad:
    case 0x1ae:
      goto switchD_0017aeb1_caseD_66;
    case 0x130:
      builtin_strncpy(errtext,"negative byte ad",0x10);
      uVar1 = 0x73736572646461;
      goto LAB_0017bb2d;
    case 0x132:
      builtin_strncpy(errtext + 0xc,"ber of elements",0x10);
      uVar3._0_1_ = 'n';
      uVar3._1_1_ = 'e';
      uVar3._2_1_ = 'g';
      uVar3._3_1_ = 'a';
      uVar5._0_1_ = 't';
      uVar5._1_1_ = 'i';
      uVar5._2_1_ = 'v';
      uVar5._3_1_ = 'e';
      uVar8._0_1_ = ' ';
      uVar8._1_1_ = 'n';
      uVar8._2_1_ = 'u';
      uVar8._3_1_ = 'm';
      uVar10._0_1_ = 'b';
      uVar10._1_1_ = 'e';
      uVar10._2_1_ = 'r';
      uVar10._3_1_ = ' ';
      break;
    case 0x133:
      builtin_strncpy(errtext,"bad first row nu",0x10);
      uVar1 = 0x7265626d756e20;
      goto LAB_0017af70;
    case 0x134:
      builtin_strncpy(errtext + 9," element number",0x10);
      uVar3._0_1_ = 'b';
      uVar3._1_1_ = 'a';
      uVar3._2_1_ = 'd';
      uVar3._3_1_ = ' ';
      uVar5._0_1_ = 'f';
      uVar5._1_1_ = 'i';
      uVar5._2_1_ = 'r';
      uVar5._3_1_ = 's';
      uVar8._0_1_ = 't';
      uVar8._1_1_ = ' ';
      uVar8._2_1_ = 'e';
      uVar8._3_1_ = 'l';
      uVar10._0_1_ = 'e';
      uVar10._1_1_ = 'm';
      uVar10._2_1_ = 'e';
      uVar10._3_1_ = 'n';
      break;
    case 0x135:
      builtin_strncpy(errtext,"not an ASCII (A)",0x10);
      uVar1 = 0x6e6d756c6f6320;
      goto LAB_0017bb75;
    case 0x136:
      builtin_strncpy(errtext + 9,"ical (L) column",0x10);
      uVar3._0_1_ = 'n';
      uVar3._1_1_ = 'o';
      uVar3._2_1_ = 't';
      uVar3._3_1_ = ' ';
      uVar5._0_1_ = 'a';
      uVar5._1_1_ = ' ';
      uVar5._2_1_ = 'l';
      uVar5._3_1_ = 'o';
      uVar8._0_1_ = 'g';
      uVar8._1_1_ = 'i';
      uVar8._2_1_ = 'c';
      uVar8._3_1_ = 'a';
      uVar10._0_1_ = 'l';
      uVar10._1_1_ = ' ';
      uVar10._2_1_ = '(';
      uVar10._3_1_ = 'L';
      break;
    case 0x137:
      builtin_strncpy(errtext + 9," table datatype",0x10);
      uVar3._0_1_ = 'b';
      uVar3._1_1_ = 'a';
      uVar3._2_1_ = 'd';
      uVar3._3_1_ = ' ';
      uVar5._0_1_ = 'A';
      uVar5._1_1_ = 'S';
      uVar5._2_1_ = 'C';
      uVar5._3_1_ = 'I';
      uVar8._0_1_ = 'I';
      uVar8._1_1_ = ' ';
      uVar8._2_1_ = 't';
      uVar8._3_1_ = 'a';
      uVar10._0_1_ = 'b';
      uVar10._1_1_ = 'l';
      uVar10._2_1_ = 'e';
      uVar10._3_1_ = ' ';
      break;
    case 0x138:
      builtin_strncpy(errtext + 10," table datatype",0x10);
      uVar3._0_1_ = 'b';
      uVar3._1_1_ = 'a';
      uVar3._2_1_ = 'd';
      uVar3._3_1_ = ' ';
      uVar5._0_1_ = 'b';
      uVar5._1_1_ = 'i';
      uVar5._2_1_ = 'n';
      uVar5._3_1_ = 'a';
      uVar8._0_1_ = 'r';
      uVar8._1_1_ = 'y';
      uVar8._2_1_ = ' ';
      uVar8._3_1_ = 't';
      uVar10._0_1_ = 'a';
      uVar10._1_1_ = 'b';
      uVar10._2_1_ = 'l';
      uVar10._3_1_ = 'e';
      break;
    case 0x13a:
      builtin_strncpy(errtext,"null value not d",0x10);
      uVar1 = 0x64656e69666564;
      goto LAB_0017bb46;
    case 0x13d:
      builtin_strncpy(errtext + 0xd,"e length column",0x10);
      uVar3._0_1_ = 'n';
      uVar3._1_1_ = 'o';
      uVar3._2_1_ = 't';
      uVar3._3_1_ = ' ';
      uVar5._0_1_ = 'a';
      uVar5._1_1_ = ' ';
      uVar5._2_1_ = 'v';
      uVar5._3_1_ = 'a';
      uVar8._0_1_ = 'r';
      uVar8._1_1_ = 'i';
      uVar8._2_1_ = 'a';
      uVar8._3_1_ = 'b';
      uVar10._0_1_ = 'l';
      uVar10._1_1_ = 'e';
      uVar10._2_1_ = ' ';
      uVar10._3_1_ = 'l';
      break;
    case 0x140:
      builtin_strncpy(errtext + 0xd,"r of dimensions",0x10);
      uVar3._0_1_ = 'i';
      uVar3._1_1_ = 'l';
      uVar3._2_1_ = 'l';
      uVar3._3_1_ = 'e';
      uVar5._0_1_ = 'g';
      uVar5._1_1_ = 'a';
      uVar5._2_1_ = 'l';
      uVar5._3_1_ = ' ';
      uVar8._0_1_ = 'n';
      uVar8._1_1_ = 'u';
      uVar8._2_1_ = 'm';
      uVar8._3_1_ = 'b';
      uVar10._0_1_ = 'e';
      uVar10._1_1_ = 'r';
      uVar10._2_1_ = ' ';
      uVar10._3_1_ = 'o';
      break;
    case 0x141:
      builtin_strncpy(errtext + 0xf," last pixel no.",0x10);
      uVar3._0_1_ = '1';
      uVar3._1_1_ = 's';
      uVar3._2_1_ = 't';
      uVar3._3_1_ = ' ';
      uVar5._0_1_ = 'p';
      uVar5._1_1_ = 'i';
      uVar5._2_1_ = 'x';
      uVar5._3_1_ = 'e';
      uVar8._0_1_ = 'l';
      uVar8._1_1_ = ' ';
      uVar8._2_1_ = 'n';
      uVar8._3_1_ = 'o';
      uVar10._0_1_ = '.';
      uVar10._1_1_ = ' ';
      uVar10._2_1_ = '>';
      uVar10._3_1_ = ' ';
      break;
    case 0x142:
      builtin_strncpy(errtext,"BSCALE or TSCALn",0x10);
      uVar1 = 0x2e30203d206e4c;
      goto LAB_0017bb2d;
    case 0x143:
      builtin_strncpy(errtext,"illegal axis len",0x10);
      uVar1 = 0x31203c20687467;
      goto LAB_0017bb75;
    case 0x154:
      uVar3._0_1_ = 'n';
      uVar3._1_1_ = 'o';
      uVar3._2_1_ = 't';
      uVar3._3_1_ = ' ';
      uVar5._0_1_ = 'g';
      uVar5._1_1_ = 'r';
      uVar5._2_1_ = 'o';
      uVar5._3_1_ = 'u';
      uVar8._0_1_ = 'p';
      uVar8._1_1_ = ' ';
      uVar8._2_1_ = 't';
      uVar8._3_1_ = 'a';
      uVar10._0_1_ = 'b';
      uVar10._1_1_ = 'l';
      uVar10._2_1_ = 'e';
      uVar10._3_1_ = '\0';
      break;
    case 0x155:
      builtin_strncpy(errtext + 0xc,"member of group",0x10);
      uVar3._0_1_ = 'H';
      uVar3._1_1_ = 'D';
      uVar3._2_1_ = 'U';
      uVar3._3_1_ = ' ';
      uVar5._0_1_ = 'a';
      uVar5._1_1_ = 'l';
      uVar5._2_1_ = 'r';
      uVar5._3_1_ = 'e';
      uVar8._0_1_ = 'a';
      uVar8._1_1_ = 'd';
      uVar8._2_1_ = 'y';
      uVar8._3_1_ = ' ';
      uVar10._0_1_ = 'm';
      uVar10._1_1_ = 'e';
      uVar10._2_1_ = 'm';
      uVar10._3_1_ = 'b';
      break;
    case 0x156:
      uVar2._0_1_ = 'g';
      uVar2._1_1_ = 'r';
      uVar2._2_1_ = 'o';
      uVar2._3_1_ = 'u';
      uVar4._0_1_ = 'p';
      uVar4._1_1_ = ' ';
      uVar4._2_1_ = 'm';
      uVar4._3_1_ = 'e';
      uVar7._0_1_ = 'm';
      uVar7._1_1_ = 'b';
      uVar7._2_1_ = 'e';
      uVar7._3_1_ = 'r';
LAB_0017bb39:
      *(undefined4 *)errtext = uVar2;
      *(undefined4 *)(errtext + 4) = uVar4;
      *(undefined4 *)(errtext + 8) = uVar7;
      errtext[0xc] = ' ';
      errtext[0xd] = 'n';
      errtext[0xe] = 'o';
      errtext[0xf] = 't';
      uVar1 = 0x646e756f662074;
      goto LAB_0017bb46;
    case 0x157:
      uVar3._0_1_ = 'g';
      uVar3._1_1_ = 'r';
      uVar3._2_1_ = 'o';
      uVar3._3_1_ = 'u';
      uVar5._0_1_ = 'p';
      uVar5._1_1_ = ' ';
      uVar5._2_1_ = 'n';
      uVar5._3_1_ = 'o';
      uVar8._0_1_ = 't';
      uVar8._1_1_ = ' ';
      uVar8._2_1_ = 'f';
      uVar8._3_1_ = 'o';
      uVar10._0_1_ = 'u';
      uVar10._1_1_ = 'n';
      uVar10._2_1_ = 'd';
      uVar10._3_1_ = '\0';
      break;
    case 0x158:
      builtin_strncpy(errtext + 5,"roup id",8);
      uVar1 = 0x756f726720646162;
LAB_0017b79e:
      *(undefined8 *)errtext = uVar1;
      return;
    case 0x159:
      builtin_strncpy(errtext,"too many HDUs tr",0x10);
      uVar1 = 0x64656b63617274;
      goto LAB_0017bb2d;
    case 0x15a:
      builtin_strncpy(errtext,"HDU alread tracked",0x13);
      return;
    case 0x15b:
      builtin_strncpy(errtext,"bad Grouping option",0x14);
      return;
    case 0x15c:
      builtin_strncpy(errtext + 0xc,"inters (groups)",0x10);
      uVar3._0_1_ = 'i';
      uVar3._1_1_ = 'd';
      uVar3._2_1_ = 'e';
      uVar3._3_1_ = 'n';
      uVar5._0_1_ = 't';
      uVar5._1_1_ = 'i';
      uVar5._2_1_ = 'c';
      uVar5._3_1_ = 'a';
      uVar8._0_1_ = 'l';
      uVar8._1_1_ = ' ';
      uVar8._2_1_ = 'p';
      uVar8._3_1_ = 'o';
      uVar10._0_1_ = 'i';
      uVar10._1_1_ = 'n';
      uVar10._2_1_ = 't';
      uVar10._3_1_ = 'e';
      break;
    case 0x168:
      builtin_strncpy(errtext,"malloc failed in",0x10);
      uVar1 = 0x72657372617020;
      goto LAB_0017bb75;
    case 0x169:
      builtin_strncpy(errtext + 10,"error in parser",0x10);
      uVar3._0_1_ = 'f';
      uVar3._1_1_ = 'i';
      uVar3._2_1_ = 'l';
      uVar3._3_1_ = 'e';
      uVar5._0_1_ = ' ';
      uVar5._1_1_ = 'r';
      uVar5._2_1_ = 'e';
      uVar5._3_1_ = 'a';
      uVar8._0_1_ = 'd';
      uVar8._1_1_ = ' ';
      uVar8._2_1_ = 'e';
      uVar8._3_1_ = 'r';
      uVar10._0_1_ = 'r';
      uVar10._1_1_ = 'o';
      uVar10._2_1_ = 'r';
      uVar10._3_1_ = ' ';
      break;
    case 0x16a:
      builtin_strncpy(errtext + 10,"er arg (parser)",0x10);
      uVar3._0_1_ = 'n';
      uVar3._1_1_ = 'u';
      uVar3._2_1_ = 'l';
      uVar3._3_1_ = 'l';
      uVar5._0_1_ = ' ';
      uVar5._1_1_ = 'p';
      uVar5._2_1_ = 'o';
      uVar5._3_1_ = 'i';
      uVar8._0_1_ = 'n';
      uVar8._1_1_ = 't';
      uVar8._2_1_ = 'e';
      uVar8._3_1_ = 'r';
      uVar10._0_1_ = ' ';
      uVar10._1_1_ = 'a';
      uVar10._2_1_ = 'r';
      uVar10._3_1_ = 'g';
      break;
    case 0x16b:
      builtin_strncpy(errtext,"empty line (parser)",0x14);
      return;
    case 0x16c:
      builtin_strncpy(errtext,"cannot unread > ",0x10);
      uVar1 = 0x656e696c203120;
LAB_0017bb46:
      *(undefined8 *)(errtext + 0xf) = uVar1;
      return;
    case 0x16d:
      builtin_strncpy(errtext + 9,"o deeply nested",0x10);
      uVar3._0_1_ = 'p';
      uVar3._1_1_ = 'a';
      uVar3._2_1_ = 'r';
      uVar3._3_1_ = 's';
      uVar5._0_1_ = 'e';
      uVar5._1_1_ = 'r';
      uVar5._2_1_ = ' ';
      uVar5._3_1_ = 't';
      uVar8._0_1_ = 'o';
      uVar8._1_1_ = 'o';
      uVar8._2_1_ = ' ';
      uVar8._3_1_ = 'd';
      uVar10._0_1_ = 'e';
      uVar10._1_1_ = 'e';
      uVar10._2_1_ = 'p';
      uVar10._3_1_ = 'l';
      break;
    case 0x16e:
      builtin_strncpy(errtext + 10,"failed (parser)",0x10);
      uVar3._0_1_ = 'f';
      uVar3._1_1_ = 'i';
      uVar3._2_1_ = 'l';
      uVar3._3_1_ = 'e';
      uVar5._0_1_ = ' ';
      uVar5._1_1_ = 'o';
      uVar5._2_1_ = 'p';
      uVar5._3_1_ = 'e';
      uVar8._0_1_ = 'n';
      uVar8._1_1_ = ' ';
      uVar8._2_1_ = 'f';
      uVar8._3_1_ = 'a';
      uVar10._0_1_ = 'i';
      uVar10._1_1_ = 'l';
      uVar10._2_1_ = 'e';
      uVar10._3_1_ = 'd';
      break;
    case 0x16f:
      builtin_strncpy(errtext,"hit EOF (parser)",0x11);
      return;
    case 0x170:
      builtin_strncpy(errtext,"bad argument (pa",0x10);
      uVar1 = 0x29726573726170;
      goto LAB_0017bb2d;
    case 0x171:
      builtin_strncpy(errtext + 10," token (parser)",0x10);
      uVar3._0_1_ = 'u';
      uVar3._1_1_ = 'n';
      uVar3._2_1_ = 'e';
      uVar3._3_1_ = 'x';
      uVar5._0_1_ = 'p';
      uVar5._1_1_ = 'e';
      uVar5._2_1_ = 'c';
      uVar5._3_1_ = 't';
      uVar8._0_1_ = 'e';
      uVar8._1_1_ = 'd';
      uVar8._2_1_ = ' ';
      uVar8._3_1_ = 't';
      uVar10._0_1_ = 'o';
      uVar10._1_1_ = 'k';
      uVar10._2_1_ = 'e';
      uVar10._3_1_ = 'n';
      break;
    case 0x191:
      builtin_strncpy(errtext + 0xd,"ring conversion",0x10);
      uVar3._0_1_ = 'b';
      uVar3._1_1_ = 'a';
      uVar3._2_1_ = 'd';
      uVar3._3_1_ = ' ';
      uVar5._0_1_ = 'i';
      uVar5._1_1_ = 'n';
      uVar5._2_1_ = 't';
      uVar5._3_1_ = ' ';
      uVar8._0_1_ = 't';
      uVar8._1_1_ = 'o';
      uVar8._2_1_ = ' ';
      uVar8._3_1_ = 's';
      uVar10._0_1_ = 't';
      uVar10._1_1_ = 'r';
      uVar10._2_1_ = 'i';
      uVar10._3_1_ = 'n';
      break;
    case 0x192:
      builtin_strncpy(errtext + 0xf,"ring conversion",0x10);
      uVar3._0_1_ = 'b';
      uVar3._1_1_ = 'a';
      uVar3._2_1_ = 'd';
      uVar3._3_1_ = ' ';
      uVar5._0_1_ = 'f';
      uVar5._1_1_ = 'l';
      uVar5._2_1_ = 'o';
      uVar5._3_1_ = 'a';
      uVar8._0_1_ = 't';
      uVar8._1_1_ = ' ';
      uVar8._2_1_ = 't';
      uVar8._3_1_ = 'o';
      uVar10._0_1_ = ' ';
      uVar10._1_1_ = 's';
      uVar10._2_1_ = 't';
      uVar10._3_1_ = 'r';
      break;
    case 0x193:
      builtin_strncpy(errtext + 10,"lue not integer",0x10);
      uVar3._0_1_ = 'k';
      uVar3._1_1_ = 'e';
      uVar3._2_1_ = 'y';
      uVar3._3_1_ = 'w';
      uVar5._0_1_ = 'o';
      uVar5._1_1_ = 'r';
      uVar5._2_1_ = 'd';
      uVar5._3_1_ = ' ';
      uVar8._0_1_ = 'v';
      uVar8._1_1_ = 'a';
      uVar8._2_1_ = 'l';
      uVar8._3_1_ = 'u';
      uVar10._0_1_ = 'e';
      uVar10._1_1_ = ' ';
      uVar10._2_1_ = 'n';
      uVar10._3_1_ = 'o';
      break;
    case 0x194:
      builtin_strncpy(errtext + 10,"lue not logical",0x10);
      uVar3._0_1_ = 'k';
      uVar3._1_1_ = 'e';
      uVar3._2_1_ = 'y';
      uVar3._3_1_ = 'w';
      uVar5._0_1_ = 'o';
      uVar5._1_1_ = 'r';
      uVar5._2_1_ = 'd';
      uVar5._3_1_ = ' ';
      uVar8._0_1_ = 'v';
      uVar8._1_1_ = 'a';
      uVar8._2_1_ = 'l';
      uVar8._3_1_ = 'u';
      uVar10._0_1_ = 'e';
      uVar10._1_1_ = ' ';
      uVar10._2_1_ = 'n';
      uVar10._3_1_ = 'o';
      break;
    case 0x195:
      builtin_strncpy(errtext + 0xe,"not floating pt",0x10);
      uVar3._0_1_ = 'k';
      uVar3._1_1_ = 'e';
      uVar3._2_1_ = 'y';
      uVar3._3_1_ = 'w';
      uVar5._0_1_ = 'o';
      uVar5._1_1_ = 'r';
      uVar5._2_1_ = 'd';
      uVar5._3_1_ = ' ';
      uVar8._0_1_ = 'v';
      uVar8._1_1_ = 'a';
      uVar8._2_1_ = 'l';
      uVar8._3_1_ = 'u';
      uVar10._0_1_ = 'e';
      uVar10._1_1_ = ' ';
      uVar10._2_1_ = 'n';
      uVar10._3_1_ = 'o';
      break;
    case 0x196:
      builtin_strncpy(errtext + 9,"alue not double",0x10);
      uVar3._0_1_ = 'k';
      uVar3._1_1_ = 'e';
      uVar3._2_1_ = 'y';
      uVar3._3_1_ = 'w';
      uVar5._0_1_ = 'o';
      uVar5._1_1_ = 'r';
      uVar5._2_1_ = 'd';
      uVar5._3_1_ = ' ';
      uVar8._0_1_ = 'v';
      uVar8._1_1_ = 'a';
      uVar8._2_1_ = 'l';
      uVar8._3_1_ = 'u';
      uVar10._0_1_ = 'e';
      uVar10._1_1_ = ' ';
      uVar10._2_1_ = 'n';
      uVar10._3_1_ = 'o';
      break;
    case 0x197:
      builtin_strncpy(errtext + 0xd," int conversion",0x10);
      uVar3._0_1_ = 'b';
      uVar3._1_1_ = 'a';
      uVar3._2_1_ = 'd';
      uVar3._3_1_ = ' ';
      uVar5._0_1_ = 's';
      uVar5._1_1_ = 't';
      uVar5._2_1_ = 'r';
      uVar5._3_1_ = 'i';
      uVar8._0_1_ = 'n';
      uVar8._1_1_ = 'g';
      uVar8._2_1_ = ' ';
      uVar8._3_1_ = 't';
      uVar10._0_1_ = 'o';
      uVar10._1_1_ = ' ';
      uVar10._2_1_ = 'i';
      uVar10._3_1_ = 'n';
      break;
    case 0x198:
      builtin_strncpy(errtext + 0xf,"loat conversion",0x10);
      uVar3._0_1_ = 'b';
      uVar3._1_1_ = 'a';
      uVar3._2_1_ = 'd';
      uVar3._3_1_ = ' ';
      uVar5._0_1_ = 's';
      uVar5._1_1_ = 't';
      uVar5._2_1_ = 'r';
      uVar5._3_1_ = 'i';
      uVar8._0_1_ = 'n';
      uVar8._1_1_ = 'g';
      uVar8._2_1_ = ' ';
      uVar8._3_1_ = 't';
      uVar10._0_1_ = 'o';
      uVar10._1_1_ = ' ';
      uVar10._2_1_ = 'f';
      uVar10._3_1_ = 'l';
      break;
    case 0x199:
      builtin_strncpy(errtext + 0xd," double convert",0x10);
      uVar3._0_1_ = 'b';
      uVar3._1_1_ = 'a';
      uVar3._2_1_ = 'd';
      uVar3._3_1_ = ' ';
      uVar5._0_1_ = 's';
      uVar5._1_1_ = 't';
      uVar5._2_1_ = 'r';
      uVar5._3_1_ = 'i';
      uVar8._0_1_ = 'n';
      uVar8._1_1_ = 'g';
      uVar8._2_1_ = ' ';
      uVar8._3_1_ = 't';
      uVar10._0_1_ = 'o';
      uVar10._1_1_ = ' ';
      uVar10._2_1_ = 'd';
      uVar10._3_1_ = 'o';
      break;
    case 0x19a:
      builtin_strncpy(errtext + 0xc,"type code value",0x10);
      uVar3._0_1_ = 'i';
      uVar3._1_1_ = 'l';
      uVar3._2_1_ = 'l';
      uVar3._3_1_ = 'e';
      uVar5._0_1_ = 'g';
      uVar5._1_1_ = 'a';
      uVar5._2_1_ = 'l';
      uVar5._3_1_ = ' ';
      uVar8._0_1_ = 'd';
      uVar8._1_1_ = 'a';
      uVar8._2_1_ = 't';
      uVar8._3_1_ = 'a';
      uVar10._0_1_ = 't';
      uVar10._1_1_ = 'y';
      uVar10._2_1_ = 'p';
      uVar10._3_1_ = 'e';
      break;
    case 0x19b:
      builtin_strncpy(errtext,"illegal no. of d",0x10);
      uVar1 = 0x736c616d696365;
      goto LAB_0017bb75;
    case 0x19c:
      builtin_strncpy(errtext + 0xd,"ersion overflow",0x10);
      uVar3._0_1_ = 'd';
      uVar3._1_1_ = 'a';
      uVar3._2_1_ = 't';
      uVar3._3_1_ = 'a';
      uVar5._0_1_ = 't';
      uVar5._1_1_ = 'y';
      uVar5._2_1_ = 'p';
      uVar5._3_1_ = 'e';
      uVar8._0_1_ = ' ';
      uVar8._1_1_ = 'c';
      uVar8._2_1_ = 'o';
      uVar8._3_1_ = 'n';
      uVar10._0_1_ = 'v';
      uVar10._1_1_ = 'e';
      uVar10._2_1_ = 'r';
      uVar10._3_1_ = 's';
      break;
    case 0x19d:
      builtin_strncpy(errtext,"error compressin",0x10);
      uVar1 = 0x6567616d692067;
      goto LAB_0017bb75;
    case 0x19e:
      builtin_strncpy(errtext + 10,"mpressing image",0x10);
      uVar3._0_1_ = 'e';
      uVar3._1_1_ = 'r';
      uVar3._2_1_ = 'r';
      uVar3._3_1_ = 'o';
      uVar5._0_1_ = 'r';
      uVar5._1_1_ = ' ';
      uVar5._2_1_ = 'u';
      uVar5._3_1_ = 'n';
      uVar8._0_1_ = 'c';
      uVar8._1_1_ = 'o';
      uVar8._2_1_ = 'm';
      uVar8._3_1_ = 'p';
      uVar10._0_1_ = 'r';
      uVar10._1_1_ = 'e';
      uVar10._2_1_ = 's';
      uVar10._3_1_ = 's';
      break;
    case 0x1a4:
      builtin_strncpy(errtext + 0xc,"time conversion",0x10);
      uVar3._0_1_ = 'b';
      uVar3._1_1_ = 'a';
      uVar3._2_1_ = 'd';
      uVar3._3_1_ = ' ';
      uVar5._0_1_ = 'd';
      uVar5._1_1_ = 'a';
      uVar5._2_1_ = 't';
      uVar5._3_1_ = 'e';
      uVar8._0_1_ = ' ';
      uVar8._1_1_ = 'o';
      uVar8._2_1_ = 'r';
      uVar8._3_1_ = ' ';
      uVar10._0_1_ = 't';
      uVar10._1_1_ = 'i';
      uVar10._2_1_ = 'm';
      uVar10._3_1_ = 'e';
      break;
    case 0x1af:
      builtin_strncpy(errtext + 0xb,"r in expression",0x10);
      uVar3._0_1_ = 's';
      uVar3._1_1_ = 'y';
      uVar3._2_1_ = 'n';
      uVar3._3_1_ = 't';
      uVar5._0_1_ = 'a';
      uVar5._1_1_ = 'x';
      uVar5._2_1_ = ' ';
      uVar5._3_1_ = 'e';
      uVar8._0_1_ = 'r';
      uVar8._1_1_ = 'r';
      uVar8._2_1_ = 'o';
      uVar8._3_1_ = 'r';
      uVar10._0_1_ = ' ';
      uVar10._1_1_ = 'i';
      uVar10._2_1_ = 'n';
      uVar10._3_1_ = ' ';
      break;
    case 0x1b0:
      builtin_strncpy(errtext + 0xd,"sult wrong type",0x10);
      uVar3._0_1_ = 'e';
      uVar3._1_1_ = 'x';
      uVar3._2_1_ = 'p';
      uVar3._3_1_ = 'r';
      uVar5._0_1_ = 'e';
      uVar5._1_1_ = 's';
      uVar5._2_1_ = 's';
      uVar5._3_1_ = 'i';
      uVar8._0_1_ = 'o';
      uVar8._1_1_ = 'n';
      uVar8._2_1_ = ' ';
      uVar8._3_1_ = 'r';
      uVar10._0_1_ = 'e';
      uVar10._1_1_ = 's';
      uVar10._2_1_ = 'u';
      uVar10._3_1_ = 'l';
      break;
    case 0x1b1:
      builtin_strncpy(errtext,"vector result to",0x10);
      uVar1 = 0x656772616c206f;
      goto LAB_0017bb75;
    case 0x1b2:
      builtin_strncpy(errtext,"missing output c",0x10);
      uVar1 = 0x6e6d756c6f6320;
LAB_0017bb2d:
      *(undefined8 *)(errtext + 0xe) = uVar1;
      return;
    case 0x1b3:
      builtin_strncpy(errtext + 10,"n parsed column",0x10);
      uVar3._0_1_ = 'b';
      uVar3._1_1_ = 'a';
      uVar3._2_1_ = 'd';
      uVar3._3_1_ = ' ';
      uVar5._0_1_ = 'd';
      uVar5._1_1_ = 'a';
      uVar5._2_1_ = 't';
      uVar5._3_1_ = 'a';
      uVar8._0_1_ = ' ';
      uVar8._1_1_ = 'i';
      uVar8._2_1_ = 'n';
      uVar8._3_1_ = ' ';
      uVar10._0_1_ = 'p';
      uVar10._1_1_ = 'a';
      uVar10._2_1_ = 'r';
      uVar10._3_1_ = 's';
      break;
    case 0x1b4:
      builtin_strncpy(errtext + 0xf,"n of wrong type",0x10);
      uVar3._0_1_ = 'o';
      uVar3._1_1_ = 'u';
      uVar3._2_1_ = 't';
      uVar3._3_1_ = 'p';
      uVar5._0_1_ = 'u';
      uVar5._1_1_ = 't';
      uVar5._2_1_ = ' ';
      uVar5._3_1_ = 'e';
      uVar8._0_1_ = 'x';
      uVar8._1_1_ = 't';
      uVar8._2_1_ = 'e';
      uVar8._3_1_ = 'n';
      uVar10._0_1_ = 's';
      uVar10._1_1_ = 'i';
      uVar10._2_1_ = 'o';
      uVar10._3_1_ = 'n';
      break;
    default:
      switch(status) {
      case 0x1f5:
        builtin_strncpy(errtext,"WCS angle too large",0x14);
        return;
      case 0x1f6:
        builtin_strncpy(errtext,"bad WCS coordinate",0x13);
        return;
      case 0x1f7:
        builtin_strncpy(errtext + 9,"WCS calculation",0x10);
        uVar3._0_1_ = 'e';
        uVar3._1_1_ = 'r';
        uVar3._2_1_ = 'r';
        uVar3._3_1_ = 'o';
        uVar5._0_1_ = 'r';
        uVar5._1_1_ = ' ';
        uVar5._2_1_ = 'i';
        uVar5._3_1_ = 'n';
        uVar8._0_1_ = ' ';
        uVar8._1_1_ = 'W';
        uVar8._2_1_ = 'C';
        uVar8._3_1_ = 'S';
        uVar10._0_1_ = ' ';
        uVar10._1_1_ = 'c';
        uVar10._2_1_ = 'a';
        uVar10._3_1_ = 'l';
        goto LAB_0017bb5d;
      case 0x1f8:
        builtin_strncpy(errtext,"bad WCS projecti",0x10);
        uVar1 = 0x65707974206e6f;
        goto LAB_0017bb75;
      case 0x1f9:
        uVar2._0_1_ = 'W';
        uVar2._1_1_ = 'C';
        uVar2._2_1_ = 'S';
        uVar2._3_1_ = ' ';
        uVar4._0_1_ = 'k';
        uVar4._1_1_ = 'e';
        uVar4._2_1_ = 'y';
        uVar4._3_1_ = 'w';
        uVar7._0_1_ = 'o';
        uVar7._1_1_ = 'r';
        uVar7._2_1_ = 'd';
        uVar7._3_1_ = 's';
        goto LAB_0017bb39;
      }
      goto switchD_0017aeb1_caseD_66;
    }
    goto LAB_0017bb5d;
  }
  switch(status) {
  case 0x65:
    builtin_strncpy(errtext + 0xc,"nd output files",0x10);
    uVar3._0_1_ = 's';
    uVar3._1_1_ = 'a';
    uVar3._2_1_ = 'm';
    uVar3._3_1_ = 'e';
    uVar5._0_1_ = ' ';
    uVar5._1_1_ = 'i';
    uVar5._2_1_ = 'n';
    uVar5._3_1_ = 'p';
    uVar8._0_1_ = 'u';
    uVar8._1_1_ = 't';
    uVar8._2_1_ = ' ';
    uVar8._3_1_ = 'a';
    uVar10._0_1_ = 'n';
    uVar10._1_1_ = 'd';
    uVar10._2_1_ = ' ';
    uVar10._3_1_ = 'o';
    break;
  case 0x66:
  case 0x6d:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x7f:
  case 0x80:
  case 0x81:
  case 0x82:
  case 0x83:
  case 0x84:
  case 0x85:
  case 0x86:
  case 0x87:
  case 0x88:
  case 0x89:
  case 0x8a:
  case 0x8b:
  case 0x8c:
  case 0x8d:
  case 0x8e:
  case 0x8f:
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
  case 0x95:
  case 0x96:
  case 0xa0:
  case 0xa1:
  case 0xa2:
  case 0xa3:
  case 0xa4:
  case 0xa5:
  case 0xa6:
  case 0xa7:
  case 0xa8:
  case 0xa9:
  case 0xaa:
  case 0xab:
  case 0xac:
  case 0xad:
  case 0xae:
  case 0xaf:
  case 0xb0:
  case 0xb1:
  case 0xb2:
  case 0xb3:
  case 0xb4:
  case 0xb5:
  case 0xb6:
  case 0xb7:
  case 0xb8:
  case 0xb9:
  case 0xba:
  case 0xbb:
  case 0xbc:
  case 0xbd:
  case 0xbe:
  case 0xbf:
  case 0xc0:
  case 0xc1:
  case 0xc2:
  case 0xc3:
  case 0xc4:
  case 0xc5:
  case 0xc6:
  case 199:
  case 200:
  case 0xee:
  case 0xef:
  case 0xf0:
  case 0xf2:
  case 0xf3:
  case 0xf4:
  case 0xf5:
  case 0xf6:
  case 0xf7:
  case 0xf8:
  case 0xf9:
  case 0xfa:
  case 0x100:
  case 0x101:
  case 0x102:
  case 0x103:
  case 0x104:
    goto switchD_0017aeb1_caseD_66;
  case 0x67:
    builtin_strncpy(errtext + 0xf," too many files",0x10);
    uVar3._0_1_ = 'a';
    uVar3._1_1_ = 't';
    uVar3._2_1_ = 't';
    uVar3._3_1_ = 'e';
    uVar5._0_1_ = 'm';
    uVar5._1_1_ = 'p';
    uVar5._2_1_ = 't';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 't';
    uVar8._1_1_ = 'o';
    uVar8._2_1_ = ' ';
    uVar8._3_1_ = 'o';
    uVar10._0_1_ = 'p';
    uVar10._1_1_ = 'e';
    uVar10._2_1_ = 'n';
    uVar10._3_1_ = ' ';
    break;
  case 0x68:
    builtin_strncpy(errtext + 0xe," the named file",0x10);
    uVar3._0_1_ = 'c';
    uVar3._1_1_ = 'o';
    uVar3._2_1_ = 'u';
    uVar3._3_1_ = 'l';
    uVar5._0_1_ = 'd';
    uVar5._1_1_ = ' ';
    uVar5._2_1_ = 'n';
    uVar5._3_1_ = 'o';
    uVar8._0_1_ = 't';
    uVar8._1_1_ = ' ';
    uVar8._2_1_ = 'o';
    uVar8._3_1_ = 'p';
    uVar10._0_1_ = 'e';
    uVar10._1_1_ = 'n';
    uVar10._2_1_ = ' ';
    uVar10._3_1_ = 't';
    break;
  case 0x69:
    builtin_strncpy(errtext + 0xf," the named file",0x10);
    uVar3._0_1_ = 'c';
    uVar3._1_1_ = 'o';
    uVar3._2_1_ = 'u';
    uVar3._3_1_ = 'l';
    uVar5._0_1_ = 'd';
    uVar5._1_1_ = 'n';
    uVar5._2_1_ = '\'';
    uVar5._3_1_ = 't';
    uVar8._0_1_ = ' ';
    uVar8._1_1_ = 'c';
    uVar8._2_1_ = 'r';
    uVar8._3_1_ = 'e';
    uVar10._0_1_ = 'a';
    uVar10._1_1_ = 't';
    uVar10._2_1_ = 'e';
    uVar10._3_1_ = ' ';
    break;
  case 0x6a:
    builtin_strncpy(errtext + 0xb,"ng to FITS file",0x10);
    uVar3._0_1_ = 'e';
    uVar3._1_1_ = 'r';
    uVar3._2_1_ = 'r';
    uVar3._3_1_ = 'o';
    uVar5._0_1_ = 'r';
    uVar5._1_1_ = ' ';
    uVar5._2_1_ = 'w';
    uVar5._3_1_ = 'r';
    uVar8._0_1_ = 'i';
    uVar8._1_1_ = 't';
    uVar8._2_1_ = 'i';
    uVar8._3_1_ = 'n';
    uVar10._0_1_ = 'g';
    uVar10._1_1_ = ' ';
    uVar10._2_1_ = 't';
    uVar10._3_1_ = 'o';
    break;
  case 0x6b:
    builtin_strncpy(errtext + 0xf,"ast end of file",0x10);
    uVar3._0_1_ = 't';
    uVar3._1_1_ = 'r';
    uVar3._2_1_ = 'i';
    uVar3._3_1_ = 'e';
    uVar5._0_1_ = 'd';
    uVar5._1_1_ = ' ';
    uVar5._2_1_ = 't';
    uVar5._3_1_ = 'o';
    uVar8._0_1_ = ' ';
    uVar8._1_1_ = 'm';
    uVar8._2_1_ = 'o';
    uVar8._3_1_ = 'v';
    uVar10._0_1_ = 'e';
    uVar10._1_1_ = ' ';
    uVar10._2_1_ = 'p';
    uVar10._3_1_ = 'a';
    break;
  case 0x6c:
    builtin_strncpy(errtext + 0xd," from FITS file",0x10);
    uVar3._0_1_ = 'e';
    uVar3._1_1_ = 'r';
    uVar3._2_1_ = 'r';
    uVar3._3_1_ = 'o';
    uVar5._0_1_ = 'r';
    uVar5._1_1_ = ' ';
    uVar5._2_1_ = 'r';
    uVar5._3_1_ = 'e';
    uVar8._0_1_ = 'a';
    uVar8._1_1_ = 'd';
    uVar8._2_1_ = 'i';
    uVar8._3_1_ = 'n';
    uVar10._0_1_ = 'g';
    uVar10._1_1_ = ' ';
    uVar10._2_1_ = 'f';
    uVar10._3_1_ = 'r';
    break;
  case 0x6e:
    builtin_strncpy(errtext + 9," close the file",0x10);
    uVar3._0_1_ = 'c';
    uVar3._1_1_ = 'o';
    uVar3._2_1_ = 'u';
    uVar3._3_1_ = 'l';
    uVar5._0_1_ = 'd';
    uVar5._1_1_ = ' ';
    uVar5._2_1_ = 'n';
    uVar5._3_1_ = 'o';
    uVar8._0_1_ = 't';
    uVar8._1_1_ = ' ';
    uVar8._2_1_ = 'c';
    uVar8._3_1_ = 'l';
    uVar10._0_1_ = 'o';
    uVar10._1_1_ = 's';
    uVar10._2_1_ = 'e';
    uVar10._3_1_ = ' ';
    break;
  case 0x6f:
    builtin_strncpy(errtext + 9,"ensions too big",0x10);
    uVar3._0_1_ = 'a';
    uVar3._1_1_ = 'r';
    uVar3._2_1_ = 'r';
    uVar3._3_1_ = 'a';
    uVar5._0_1_ = 'y';
    uVar5._1_1_ = ' ';
    uVar5._2_1_ = 'd';
    uVar5._3_1_ = 'i';
    uVar8._0_1_ = 'm';
    uVar8._1_1_ = 'e';
    uVar8._2_1_ = 'n';
    uVar8._3_1_ = 's';
    uVar10._0_1_ = 'i';
    uVar10._1_1_ = 'o';
    uVar10._2_1_ = 'n';
    uVar10._3_1_ = 's';
    break;
  case 0x70:
    builtin_strncpy(errtext + 0xe,"o readonly file",0x10);
    uVar3._0_1_ = 'c';
    uVar3._1_1_ = 'a';
    uVar3._2_1_ = 'n';
    uVar3._3_1_ = 'n';
    uVar5._0_1_ = 'o';
    uVar5._1_1_ = 't';
    uVar5._2_1_ = ' ';
    uVar5._3_1_ = 'w';
    uVar8._0_1_ = 'r';
    uVar8._1_1_ = 'i';
    uVar8._2_1_ = 't';
    uVar8._3_1_ = 'e';
    uVar10._0_1_ = ' ';
    uVar10._1_1_ = 't';
    uVar10._2_1_ = 'o';
    uVar10._3_1_ = ' ';
    break;
  case 0x71:
    builtin_strncpy(errtext + 10,"allocate memory",0x10);
    uVar3._0_1_ = 'c';
    uVar3._1_1_ = 'o';
    uVar3._2_1_ = 'u';
    uVar3._3_1_ = 'l';
    uVar5._0_1_ = 'd';
    uVar5._1_1_ = ' ';
    uVar5._2_1_ = 'n';
    uVar5._3_1_ = 'o';
    uVar8._0_1_ = 't';
    uVar8._1_1_ = ' ';
    uVar8._2_1_ = 'a';
    uVar8._3_1_ = 'l';
    uVar10._0_1_ = 'l';
    uVar10._1_1_ = 'o';
    uVar10._2_1_ = 'c';
    uVar10._3_1_ = 'a';
    break;
  case 0x72:
    builtin_strncpy(errtext + 9,"itsfile pointer",0x10);
    uVar3._0_1_ = 'i';
    uVar3._1_1_ = 'n';
    uVar3._2_1_ = 'v';
    uVar3._3_1_ = 'a';
    uVar5._0_1_ = 'l';
    uVar5._1_1_ = 'i';
    uVar5._2_1_ = 'd';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 'f';
    uVar8._1_1_ = 'i';
    uVar8._2_1_ = 't';
    uVar8._3_1_ = 's';
    uVar10._0_1_ = 'f';
    uVar10._1_1_ = 'i';
    uVar10._2_1_ = 'l';
    uVar10._3_1_ = 'e';
    break;
  case 0x73:
    builtin_strncpy(errtext,"NULL input pointer",0x13);
    return;
  case 0x74:
    builtin_strncpy(errtext + 0xc,"g file position",0x10);
    uVar3._0_1_ = 'e';
    uVar3._1_1_ = 'r';
    uVar3._2_1_ = 'r';
    uVar3._3_1_ = 'o';
    uVar5._0_1_ = 'r';
    uVar5._1_1_ = ' ';
    uVar5._2_1_ = 's';
    uVar5._3_1_ = 'e';
    uVar8._0_1_ = 'e';
    uVar8._1_1_ = 'k';
    uVar8._2_1_ = 'i';
    uVar8._3_1_ = 'n';
    uVar10._0_1_ = 'g';
    uVar10._1_1_ = ' ';
    uVar10._2_1_ = 'f';
    uVar10._3_1_ = 'i';
    break;
  case 0x75:
    builtin_strncpy(errtext + 0x10,"le download timeout setting",0x1c);
    uVar3._0_1_ = 'b';
    uVar3._1_1_ = 'a';
    uVar3._2_1_ = 'd';
    uVar3._3_1_ = ' ';
    uVar5._0_1_ = 'v';
    uVar5._1_1_ = 'a';
    uVar5._2_1_ = 'l';
    uVar5._3_1_ = 'u';
    uVar8._0_1_ = 'e';
    uVar8._1_1_ = ' ';
    uVar8._2_1_ = 'f';
    uVar8._3_1_ = 'o';
    uVar10._0_1_ = 'r';
    uVar10._1_1_ = ' ';
    uVar10._2_1_ = 'f';
    uVar10._3_1_ = 'i';
    break;
  case 0x79:
    builtin_strncpy(errtext,"invalid URL prefix",0x13);
    return;
  case 0x7a:
    builtin_strncpy(errtext,"too many I/O dri",0x10);
    uVar1 = 0x73726576697264;
    goto LAB_0017af70;
  case 0x7b:
    builtin_strncpy(errtext,"I/O driver init ",0x10);
    uVar1 = 0x64656c69616620;
    goto LAB_0017bb46;
  case 0x7c:
    builtin_strncpy(errtext + 0xf,"or this URLtype",0x10);
    uVar3._0_1_ = 'n';
    uVar3._1_1_ = 'o';
    uVar3._2_1_ = ' ';
    uVar3._3_1_ = 'I';
    uVar5._0_1_ = '/';
    uVar5._1_1_ = 'O';
    uVar5._2_1_ = ' ';
    uVar5._3_1_ = 'd';
    uVar8._0_1_ = 'r';
    uVar8._1_1_ = 'i';
    uVar8._2_1_ = 'v';
    uVar8._3_1_ = 'e';
    uVar10._0_1_ = 'r';
    uVar10._1_1_ = ' ';
    uVar10._2_1_ = 'f';
    uVar10._3_1_ = 'o';
    break;
  case 0x7d:
    builtin_strncpy(errtext + 0xe," input file URL",0x10);
    uVar3._0_1_ = 'p';
    uVar3._1_1_ = 'a';
    uVar3._2_1_ = 'r';
    uVar3._3_1_ = 's';
    uVar5._0_1_ = 'e';
    uVar5._1_1_ = ' ';
    uVar5._2_1_ = 'e';
    uVar5._3_1_ = 'r';
    uVar8._0_1_ = 'r';
    uVar8._1_1_ = 'o';
    uVar8._2_1_ = 'r';
    uVar8._3_1_ = ' ';
    uVar10._0_1_ = 'i';
    uVar10._1_1_ = 'n';
    uVar10._2_1_ = ' ';
    uVar10._3_1_ = 'i';
    break;
  case 0x7e:
    builtin_strncpy(errtext + 10,"r in range list",0x10);
    uVar3._0_1_ = 'p';
    uVar3._1_1_ = 'a';
    uVar3._2_1_ = 'r';
    uVar3._3_1_ = 's';
    uVar5._0_1_ = 'e';
    uVar5._1_1_ = ' ';
    uVar5._2_1_ = 'e';
    uVar5._3_1_ = 'r';
    uVar8._0_1_ = 'r';
    uVar8._1_1_ = 'o';
    uVar8._2_1_ = 'r';
    uVar8._3_1_ = ' ';
    uVar10._0_1_ = 'i';
    uVar10._1_1_ = 'n';
    uVar10._2_1_ = ' ';
    uVar10._3_1_ = 'r';
    break;
  case 0x97:
    builtin_strncpy(errtext + 0xf,"hared mem drvr)",0x10);
    uVar3._0_1_ = 'b';
    uVar3._1_1_ = 'a';
    uVar3._2_1_ = 'd';
    uVar3._3_1_ = ' ';
    uVar5._0_1_ = 'a';
    uVar5._1_1_ = 'r';
    uVar5._2_1_ = 'g';
    uVar5._3_1_ = 'u';
    uVar8._0_1_ = 'm';
    uVar8._1_1_ = 'e';
    uVar8._2_1_ = 'n';
    uVar8._3_1_ = 't';
    uVar10._0_1_ = ' ';
    uVar10._1_1_ = '(';
    uVar10._2_1_ = 's';
    uVar10._3_1_ = 'h';
    break;
  case 0x98:
    builtin_strncpy(errtext + 0xf,"hared mem drvr)",0x10);
    uVar3._0_1_ = 'n';
    uVar3._1_1_ = 'u';
    uVar3._2_1_ = 'l';
    uVar3._3_1_ = 'l';
    uVar5._0_1_ = ' ';
    uVar5._1_1_ = 'p';
    uVar5._2_1_ = 't';
    uVar5._3_1_ = 'r';
    uVar8._0_1_ = ' ';
    uVar8._1_1_ = 'a';
    uVar8._2_1_ = 'r';
    uVar8._3_1_ = 'g';
    uVar10._0_1_ = ' ';
    uVar10._1_1_ = '(';
    uVar10._2_1_ = 's';
    uVar10._3_1_ = 'h';
    break;
  case 0x99:
    builtin_strncpy(errtext + 0xe," memory handles",0x10);
    uVar3._0_1_ = 'n';
    uVar3._1_1_ = 'o';
    uVar3._2_1_ = ' ';
    uVar3._3_1_ = 'f';
    uVar5._0_1_ = 'r';
    uVar5._1_1_ = 'e';
    uVar5._2_1_ = 'e';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 's';
    uVar8._1_1_ = 'h';
    uVar8._2_1_ = 'a';
    uVar8._3_1_ = 'r';
    uVar10._0_1_ = 'e';
    uVar10._1_1_ = 'd';
    uVar10._2_1_ = ' ';
    uVar10._3_1_ = 'm';
    break;
  case 0x9a:
    builtin_strncpy(errtext + 0xf,"not initialized",0x10);
    uVar3._0_1_ = 's';
    uVar3._1_1_ = 'h';
    uVar3._2_1_ = 'a';
    uVar3._3_1_ = 'r';
    uVar5._0_1_ = 'e';
    uVar5._1_1_ = ' ';
    uVar5._2_1_ = 'm';
    uVar5._3_1_ = 'e';
    uVar8._0_1_ = 'm';
    uVar8._1_1_ = ' ';
    uVar8._2_1_ = 'd';
    uVar8._3_1_ = 'r';
    uVar10._0_1_ = 'v';
    uVar10._1_1_ = 'r';
    uVar10._2_1_ = ' ';
    uVar10._3_1_ = 'n';
    break;
  case 0x9b:
    builtin_strncpy(errtext + 0xe,"or (shared mem)",0x10);
    uVar3._0_1_ = 'I';
    uVar3._1_1_ = 'P';
    uVar3._2_1_ = 'C';
    uVar3._3_1_ = ' ';
    uVar5._0_1_ = 's';
    uVar5._1_1_ = 'y';
    uVar5._2_1_ = 's';
    uVar5._3_1_ = 't';
    uVar8._0_1_ = 'e';
    uVar8._1_1_ = 'm';
    uVar8._2_1_ = ' ';
    uVar8._3_1_ = 'e';
    uVar10._0_1_ = 'r';
    uVar10._1_1_ = 'r';
    uVar10._2_1_ = 'o';
    uVar10._3_1_ = 'r';
    break;
  case 0x9c:
    builtin_strncpy(errtext + 0xc,"hared mem drvr)",0x10);
    uVar3._0_1_ = 'n';
    uVar3._1_1_ = 'o';
    uVar3._2_1_ = ' ';
    uVar3._3_1_ = 'm';
    uVar5._0_1_ = 'e';
    uVar5._1_1_ = 'm';
    uVar5._2_1_ = 'o';
    uVar5._3_1_ = 'r';
    uVar8._0_1_ = 'y';
    uVar8._1_1_ = ' ';
    uVar8._2_1_ = '(';
    uVar8._3_1_ = 's';
    uVar10._0_1_ = 'h';
    uVar10._1_1_ = 'a';
    uVar10._2_1_ = 'r';
    uVar10._3_1_ = 'e';
    break;
  case 0x9d:
    builtin_strncpy(errtext + 0xc,"source deadlock",0x10);
    uVar3._0_1_ = 's';
    uVar3._1_1_ = 'h';
    uVar3._2_1_ = 'a';
    uVar3._3_1_ = 'r';
    uVar5._0_1_ = 'e';
    uVar5._1_1_ = ' ';
    uVar5._2_1_ = 'm';
    uVar5._3_1_ = 'e';
    uVar8._0_1_ = 'm';
    uVar8._1_1_ = ' ';
    uVar8._2_1_ = 'r';
    uVar8._3_1_ = 'e';
    uVar10._0_1_ = 's';
    uVar10._1_1_ = 'o';
    uVar10._2_1_ = 'u';
    uVar10._3_1_ = 'r';
    break;
  case 0x9e:
    builtin_strncpy(errtext + 0xd,"n/create failed",0x10);
    uVar3._0_1_ = 'l';
    uVar3._1_1_ = 'o';
    uVar3._2_1_ = 'c';
    uVar3._3_1_ = 'k';
    uVar5._0_1_ = ' ';
    uVar5._1_1_ = 'f';
    uVar5._2_1_ = 'i';
    uVar5._3_1_ = 'l';
    uVar8._0_1_ = 'e';
    uVar8._1_1_ = ' ';
    uVar8._2_1_ = 'o';
    uVar8._3_1_ = 'p';
    uVar10._0_1_ = 'e';
    uVar10._1_1_ = 'n';
    uVar10._2_1_ = '/';
    uVar10._3_1_ = 'c';
    break;
  case 0x9f:
    builtin_strncpy(errtext + 0xd,"share mem block",0x10);
    uVar3._0_1_ = 'c';
    uVar3._1_1_ = 'a';
    uVar3._2_1_ = 'n';
    uVar3._3_1_ = '\'';
    uVar5._0_1_ = 't';
    uVar5._1_1_ = ' ';
    uVar5._2_1_ = 'r';
    uVar5._3_1_ = 'e';
    uVar8._0_1_ = 's';
    uVar8._1_1_ = 'i';
    uVar8._2_1_ = 'z';
    uVar8._3_1_ = 'e';
    uVar10._0_1_ = ' ';
    uVar10._1_1_ = 's';
    uVar10._2_1_ = 'h';
    uVar10._3_1_ = 'a';
    break;
  case 0xc9:
    builtin_strncpy(errtext + 0xc,"dy has keywords",0x10);
    uVar3._0_1_ = 'h';
    uVar3._1_1_ = 'e';
    uVar3._2_1_ = 'a';
    uVar3._3_1_ = 'd';
    uVar5._0_1_ = 'e';
    uVar5._1_1_ = 'r';
    uVar5._2_1_ = ' ';
    uVar5._3_1_ = 'a';
    uVar8._0_1_ = 'l';
    uVar8._1_1_ = 'r';
    uVar8._2_1_ = 'e';
    uVar8._3_1_ = 'a';
    uVar10._0_1_ = 'd';
    uVar10._1_1_ = 'y';
    uVar10._2_1_ = ' ';
    uVar10._3_1_ = 'h';
    break;
  case 0xca:
    builtin_strncpy(errtext + 0xc,"found in header",0x10);
    uVar3._0_1_ = 'k';
    uVar3._1_1_ = 'e';
    uVar3._2_1_ = 'y';
    uVar3._3_1_ = 'w';
    uVar5._0_1_ = 'o';
    uVar5._1_1_ = 'r';
    uVar5._2_1_ = 'd';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 'n';
    uVar8._1_1_ = 'o';
    uVar8._2_1_ = 't';
    uVar8._3_1_ = ' ';
    uVar10._0_1_ = 'f';
    uVar10._1_1_ = 'o';
    uVar10._2_1_ = 'u';
    uVar10._3_1_ = 'n';
    break;
  case 0xcb:
    builtin_strncpy(errtext + 0xd,"r out of bounds",0x10);
    uVar3._0_1_ = 'k';
    uVar3._1_1_ = 'e';
    uVar3._2_1_ = 'y';
    uVar3._3_1_ = 'w';
    uVar5._0_1_ = 'o';
    uVar5._1_1_ = 'r';
    uVar5._2_1_ = 'd';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 'n';
    uVar8._1_1_ = 'u';
    uVar8._2_1_ = 'm';
    uVar8._3_1_ = 'b';
    uVar10._0_1_ = 'e';
    uVar10._1_1_ = 'r';
    uVar10._2_1_ = ' ';
    uVar10._3_1_ = 'o';
    break;
  case 0xcc:
    builtin_strncpy(errtext + 0xb,"ue is undefined",0x10);
    uVar3._0_1_ = 'k';
    uVar3._1_1_ = 'e';
    uVar3._2_1_ = 'y';
    uVar3._3_1_ = 'w';
    uVar5._0_1_ = 'o';
    uVar5._1_1_ = 'r';
    uVar5._2_1_ = 'd';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 'v';
    uVar8._1_1_ = 'a';
    uVar8._2_1_ = 'l';
    uVar8._3_1_ = 'u';
    uVar10._0_1_ = 'e';
    uVar10._1_1_ = ' ';
    uVar10._2_1_ = 'i';
    uVar10._3_1_ = 's';
    break;
  case 0xcd:
    builtin_strncpy(errtext + 0xd,"g closing quote",0x10);
    uVar3._0_1_ = 's';
    uVar3._1_1_ = 't';
    uVar3._2_1_ = 'r';
    uVar3._3_1_ = 'i';
    uVar5._0_1_ = 'n';
    uVar5._1_1_ = 'g';
    uVar5._2_1_ = ' ';
    uVar5._3_1_ = 'm';
    uVar8._0_1_ = 'i';
    uVar8._1_1_ = 's';
    uVar8._2_1_ = 's';
    uVar8._3_1_ = 'i';
    uVar10._0_1_ = 'n';
    uVar10._1_1_ = 'g';
    uVar10._2_1_ = ' ';
    uVar10._3_1_ = 'c';
    break;
  case 0xce:
    builtin_strncpy(errtext + 0xe,"ed keyword name",0x10);
    uVar3._0_1_ = 'e';
    uVar3._1_1_ = 'r';
    uVar3._2_1_ = 'r';
    uVar3._3_1_ = 'o';
    uVar5._0_1_ = 'r';
    uVar5._1_1_ = ' ';
    uVar5._2_1_ = 'i';
    uVar5._3_1_ = 'n';
    uVar8._0_1_ = ' ';
    uVar8._1_1_ = 'i';
    uVar8._2_1_ = 'n';
    uVar8._3_1_ = 'd';
    uVar10._0_1_ = 'e';
    uVar10._1_1_ = 'x';
    uVar10._2_1_ = 'e';
    uVar10._3_1_ = 'd';
    break;
  case 0xcf:
    builtin_strncpy(errtext + 0xd,"cter in keyword",0x10);
    uVar3._0_1_ = 'i';
    uVar3._1_1_ = 'l';
    uVar3._2_1_ = 'l';
    uVar3._3_1_ = 'e';
    uVar5._0_1_ = 'g';
    uVar5._1_1_ = 'a';
    uVar5._2_1_ = 'l';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 'c';
    uVar8._1_1_ = 'h';
    uVar8._2_1_ = 'a';
    uVar8._3_1_ = 'r';
    uVar10._0_1_ = 'a';
    uVar10._1_1_ = 'c';
    uVar10._2_1_ = 't';
    uVar10._3_1_ = 'e';
    break;
  case 0xd0:
    builtin_strncpy(errtext + 0xf,"ds out of order",0x10);
    uVar3._0_1_ = 'r';
    uVar3._1_1_ = 'e';
    uVar3._2_1_ = 'q';
    uVar3._3_1_ = 'u';
    uVar5._0_1_ = 'i';
    uVar5._1_1_ = 'r';
    uVar5._2_1_ = 'e';
    uVar5._3_1_ = 'd';
    uVar8._0_1_ = ' ';
    uVar8._1_1_ = 'k';
    uVar8._2_1_ = 'e';
    uVar8._3_1_ = 'y';
    uVar10._0_1_ = 'w';
    uVar10._1_1_ = 'o';
    uVar10._2_1_ = 'r';
    uVar10._3_1_ = 'd';
    break;
  case 0xd1:
    builtin_strncpy(errtext + 0xf,"ot positive int",0x10);
    uVar3._0_1_ = 'k';
    uVar3._1_1_ = 'e';
    uVar3._2_1_ = 'y';
    uVar3._3_1_ = 'w';
    uVar5._0_1_ = 'o';
    uVar5._1_1_ = 'r';
    uVar5._2_1_ = 'd';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 'v';
    uVar8._1_1_ = 'a';
    uVar8._2_1_ = 'l';
    uVar8._3_1_ = 'u';
    uVar10._0_1_ = 'e';
    uVar10._1_1_ = ' ';
    uVar10._2_1_ = 'n';
    uVar10._3_1_ = 'o';
    break;
  case 0xd2:
    builtin_strncpy(errtext,"END keyword not ",0x10);
    uVar1 = 0x646e756f662074;
    goto LAB_0017bb2d;
  case 0xd3:
    builtin_strncpy(errtext + 0xd,"X keyword value",0x10);
    uVar3._0_1_ = 'i';
    uVar3._1_1_ = 'l';
    uVar3._2_1_ = 'l';
    uVar3._3_1_ = 'e';
    uVar5._0_1_ = 'g';
    uVar5._1_1_ = 'a';
    uVar5._2_1_ = 'l';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 'B';
    uVar8._1_1_ = 'I';
    uVar8._2_1_ = 'T';
    uVar8._3_1_ = 'P';
    uVar10._0_1_ = 'I';
    uVar10._1_1_ = 'X';
    uVar10._2_1_ = ' ';
    uVar10._3_1_ = 'k';
    break;
  case 0xd4:
    builtin_strncpy(errtext + 0xc,"S keyword value",0x10);
    uVar3._0_1_ = 'i';
    uVar3._1_1_ = 'l';
    uVar3._2_1_ = 'l';
    uVar3._3_1_ = 'e';
    uVar5._0_1_ = 'g';
    uVar5._1_1_ = 'a';
    uVar5._2_1_ = 'l';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 'N';
    uVar8._1_1_ = 'A';
    uVar8._2_1_ = 'X';
    uVar8._3_1_ = 'I';
    uVar10._0_1_ = 'S';
    uVar10._1_1_ = ' ';
    uVar10._2_1_ = 'k';
    uVar10._3_1_ = 'e';
    break;
  case 0xd5:
    builtin_strncpy(errtext + 0xd,"n keyword value",0x10);
    uVar3._0_1_ = 'i';
    uVar3._1_1_ = 'l';
    uVar3._2_1_ = 'l';
    uVar3._3_1_ = 'e';
    uVar5._0_1_ = 'g';
    uVar5._1_1_ = 'a';
    uVar5._2_1_ = 'l';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 'N';
    uVar8._1_1_ = 'A';
    uVar8._2_1_ = 'X';
    uVar8._3_1_ = 'I';
    uVar10._0_1_ = 'S';
    uVar10._1_1_ = 'n';
    uVar10._2_1_ = ' ';
    uVar10._3_1_ = 'k';
    break;
  case 0xd6:
    builtin_strncpy(errtext + 0xd,"T keyword value",0x10);
    uVar3._0_1_ = 'i';
    uVar3._1_1_ = 'l';
    uVar3._2_1_ = 'l';
    uVar3._3_1_ = 'e';
    uVar5._0_1_ = 'g';
    uVar5._1_1_ = 'a';
    uVar5._2_1_ = 'l';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 'P';
    uVar8._1_1_ = 'C';
    uVar8._2_1_ = 'O';
    uVar8._3_1_ = 'U';
    uVar10._0_1_ = 'N';
    uVar10._1_1_ = 'T';
    uVar10._2_1_ = ' ';
    uVar10._3_1_ = 'k';
    break;
  case 0xd7:
    builtin_strncpy(errtext + 0xd,"T keyword value",0x10);
    uVar3._0_1_ = 'i';
    uVar3._1_1_ = 'l';
    uVar3._2_1_ = 'l';
    uVar3._3_1_ = 'e';
    uVar5._0_1_ = 'g';
    uVar5._1_1_ = 'a';
    uVar5._2_1_ = 'l';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 'G';
    uVar8._1_1_ = 'C';
    uVar8._2_1_ = 'O';
    uVar8._3_1_ = 'U';
    uVar10._0_1_ = 'N';
    uVar10._1_1_ = 'T';
    uVar10._2_1_ = ' ';
    uVar10._3_1_ = 'k';
    break;
  case 0xd8:
    builtin_strncpy(errtext + 0xe,"S keyword value",0x10);
    uVar3._0_1_ = 'i';
    uVar3._1_1_ = 'l';
    uVar3._2_1_ = 'l';
    uVar3._3_1_ = 'e';
    uVar5._0_1_ = 'g';
    uVar5._1_1_ = 'a';
    uVar5._2_1_ = 'l';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 'T';
    uVar8._1_1_ = 'F';
    uVar8._2_1_ = 'I';
    uVar8._3_1_ = 'E';
    uVar10._0_1_ = 'L';
    uVar10._1_1_ = 'D';
    uVar10._2_1_ = 'S';
    uVar10._3_1_ = ' ';
    break;
  case 0xd9:
    builtin_strncpy(errtext,"negative table r",0x10);
    uVar1 = 0x657a697320776f;
    goto LAB_0017bb75;
  case 0xda:
    builtin_strncpy(errtext,"negative number ",0x10);
    uVar1 = 0x73776f7220666f;
    goto LAB_0017bb75;
  case 0xdb:
    uVar2._0_1_ = 'n';
    uVar2._1_1_ = 'a';
    uVar2._2_1_ = 'm';
    uVar2._3_1_ = 'e';
    uVar4._0_1_ = 'd';
    uVar4._1_1_ = ' ';
    uVar4._2_1_ = 'c';
    uVar4._3_1_ = 'o';
    uVar7._0_1_ = 'l';
    uVar7._1_1_ = 'u';
    uVar7._2_1_ = 'm';
    uVar7._3_1_ = 'n';
    goto LAB_0017bb39;
  case 0xdc:
    builtin_strncpy(errtext + 0xd,"E keyword value",0x10);
    uVar3._0_1_ = 'i';
    uVar3._1_1_ = 'l';
    uVar3._2_1_ = 'l';
    uVar3._3_1_ = 'e';
    uVar5._0_1_ = 'g';
    uVar5._1_1_ = 'a';
    uVar5._2_1_ = 'l';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 'S';
    uVar8._1_1_ = 'I';
    uVar8._2_1_ = 'M';
    uVar8._3_1_ = 'P';
    uVar10._0_1_ = 'L';
    uVar10._1_1_ = 'E';
    uVar10._2_1_ = ' ';
    uVar10._3_1_ = 'k';
    break;
  case 0xdd:
    builtin_strncpy(errtext + 9,"word not SIMPLE",0x10);
    uVar3._0_1_ = 'f';
    uVar3._1_1_ = 'i';
    uVar3._2_1_ = 'r';
    uVar3._3_1_ = 's';
    uVar5._0_1_ = 't';
    uVar5._1_1_ = ' ';
    uVar5._2_1_ = 'k';
    uVar5._3_1_ = 'e';
    uVar8._0_1_ = 'y';
    uVar8._1_1_ = 'w';
    uVar8._2_1_ = 'o';
    uVar8._3_1_ = 'r';
    uVar10._0_1_ = 'd';
    uVar10._1_1_ = ' ';
    uVar10._2_1_ = 'n';
    uVar10._3_1_ = 'o';
    break;
  case 0xde:
    builtin_strncpy(errtext + 10,"word not BITPIX",0x10);
    uVar3._0_1_ = 's';
    uVar3._1_1_ = 'e';
    uVar3._2_1_ = 'c';
    uVar3._3_1_ = 'o';
    uVar5._0_1_ = 'n';
    uVar5._1_1_ = 'd';
    uVar5._2_1_ = ' ';
    uVar5._3_1_ = 'k';
    uVar8._0_1_ = 'e';
    uVar8._1_1_ = 'y';
    uVar8._2_1_ = 'w';
    uVar8._3_1_ = 'o';
    uVar10._0_1_ = 'r';
    uVar10._1_1_ = 'd';
    uVar10._2_1_ = ' ';
    uVar10._3_1_ = 'n';
    break;
  case 0xdf:
    builtin_strncpy(errtext,"third keyword no",0x10);
    uVar1 = 0x534958414e2074;
    goto LAB_0017bb75;
  case 0xe0:
    builtin_strncpy(errtext,"missing NAXISn k",0x10);
    uVar1 = 0x7364726f777965;
    goto LAB_0017bb75;
  case 0xe1:
    builtin_strncpy(errtext + 0xb,"rd not XTENSION",0x10);
    uVar3._0_1_ = 'f';
    uVar3._1_1_ = 'i';
    uVar3._2_1_ = 'r';
    uVar3._3_1_ = 's';
    uVar5._0_1_ = 't';
    uVar5._1_1_ = ' ';
    uVar5._2_1_ = 'k';
    uVar5._3_1_ = 'e';
    uVar8._0_1_ = 'y';
    uVar8._1_1_ = 'w';
    uVar8._2_1_ = 'o';
    uVar8._3_1_ = 'r';
    uVar10._0_1_ = 'd';
    uVar10._1_1_ = ' ';
    uVar10._2_1_ = 'n';
    uVar10._3_1_ = 'o';
    break;
  case 0xe2:
    builtin_strncpy(errtext,"CHDU not an ASCI",0x10);
    uVar1 = 0x656c6261742049;
    goto LAB_0017bb75;
  case 0xe3:
    builtin_strncpy(errtext,"CHDU not a binar",0x10);
    uVar1 = 0x656c6261742079;
LAB_0017bb75:
    *(undefined8 *)(errtext + 0x10) = uVar1;
    return;
  case 0xe4:
    builtin_strncpy(errtext + 9,"yword not found",0x10);
    uVar3._0_1_ = 'P';
    uVar3._1_1_ = 'C';
    uVar3._2_1_ = 'O';
    uVar3._3_1_ = 'U';
    uVar5._0_1_ = 'N';
    uVar5._1_1_ = 'T';
    uVar5._2_1_ = ' ';
    uVar5._3_1_ = 'k';
    uVar8._0_1_ = 'e';
    uVar8._1_1_ = 'y';
    uVar8._2_1_ = 'w';
    uVar8._3_1_ = 'o';
    uVar10._0_1_ = 'r';
    uVar10._1_1_ = 'd';
    uVar10._2_1_ = ' ';
    uVar10._3_1_ = 'n';
    break;
  case 0xe5:
    builtin_strncpy(errtext + 9,"yword not found",0x10);
    uVar3._0_1_ = 'G';
    uVar3._1_1_ = 'C';
    uVar3._2_1_ = 'O';
    uVar3._3_1_ = 'U';
    uVar5._0_1_ = 'N';
    uVar5._1_1_ = 'T';
    uVar5._2_1_ = ' ';
    uVar5._3_1_ = 'k';
    uVar8._0_1_ = 'e';
    uVar8._1_1_ = 'y';
    uVar8._2_1_ = 'w';
    uVar8._3_1_ = 'o';
    uVar10._0_1_ = 'r';
    uVar10._1_1_ = 'd';
    uVar10._2_1_ = ' ';
    uVar10._3_1_ = 'n';
    break;
  case 0xe6:
    builtin_strncpy(errtext + 10,"yword not found",0x10);
    uVar3._0_1_ = 'T';
    uVar3._1_1_ = 'F';
    uVar3._2_1_ = 'I';
    uVar3._3_1_ = 'E';
    uVar5._0_1_ = 'L';
    uVar5._1_1_ = 'D';
    uVar5._2_1_ = 'S';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 'k';
    uVar8._1_1_ = 'e';
    uVar8._2_1_ = 'y';
    uVar8._3_1_ = 'w';
    uVar10._0_1_ = 'o';
    uVar10._1_1_ = 'r';
    uVar10._2_1_ = 'd';
    uVar10._3_1_ = ' ';
    break;
  case 0xe7:
    uVar6._0_1_ = 'T';
    uVar6._1_1_ = 'B';
    uVar6._2_1_ = 'C';
    uVar6._3_1_ = 'O';
    uVar9._0_1_ = 'L';
    uVar9._1_1_ = 'n';
    uVar9._2_1_ = ' ';
    uVar9._3_1_ = 'k';
    goto LAB_0017b254;
  case 0xe8:
    uVar6._0_1_ = 'T';
    uVar6._1_1_ = 'F';
    uVar6._2_1_ = 'O';
    uVar6._3_1_ = 'R';
    uVar9._0_1_ = 'M';
    uVar9._1_1_ = 'n';
    uVar9._2_1_ = ' ';
    uVar9._3_1_ = 'k';
LAB_0017b254:
    errtext[0] = 'm';
    errtext[1] = 'i';
    errtext[2] = 's';
    errtext[3] = 's';
    errtext[4] = 'i';
    errtext[5] = 'n';
    errtext[6] = 'g';
    errtext[7] = ' ';
    *(undefined4 *)(errtext + 8) = uVar6;
    *(undefined4 *)(errtext + 0xc) = uVar9;
    uVar1 = 0x64726f7779656b;
    goto LAB_0017bb46;
  case 0xe9:
    builtin_strncpy(errtext + 0xc,"IMAGE extension",0x10);
    uVar3._0_1_ = 'C';
    uVar3._1_1_ = 'H';
    uVar3._2_1_ = 'D';
    uVar3._3_1_ = 'U';
    uVar5._0_1_ = ' ';
    uVar5._1_1_ = 'n';
    uVar5._2_1_ = 'o';
    uVar5._3_1_ = 't';
    uVar8._0_1_ = ' ';
    uVar8._1_1_ = 'a';
    uVar8._2_1_ = 'n';
    uVar8._3_1_ = ' ';
    uVar10._0_1_ = 'I';
    uVar10._1_1_ = 'M';
    uVar10._2_1_ = 'A';
    uVar10._3_1_ = 'G';
    break;
  case 0xea:
    builtin_strncpy(errtext + 0xd,"n keyword value",0x10);
    uVar3._0_1_ = 'i';
    uVar3._1_1_ = 'l';
    uVar3._2_1_ = 'l';
    uVar3._3_1_ = 'e';
    uVar5._0_1_ = 'g';
    uVar5._1_1_ = 'a';
    uVar5._2_1_ = 'l';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 'T';
    uVar8._1_1_ = 'B';
    uVar8._2_1_ = 'C';
    uVar8._3_1_ = 'O';
    uVar10._0_1_ = 'L';
    uVar10._1_1_ = 'n';
    uVar10._2_1_ = ' ';
    uVar10._3_1_ = 'k';
    break;
  case 0xeb:
    builtin_strncpy(errtext + 0xb,"table extension",0x10);
    uVar3._0_1_ = 'C';
    uVar3._1_1_ = 'H';
    uVar3._2_1_ = 'D';
    uVar3._3_1_ = 'U';
    uVar5._0_1_ = ' ';
    uVar5._1_1_ = 'n';
    uVar5._2_1_ = 'o';
    uVar5._3_1_ = 't';
    uVar8._0_1_ = ' ';
    uVar8._1_1_ = 'a';
    uVar8._2_1_ = ' ';
    uVar8._3_1_ = 't';
    uVar10._0_1_ = 'a';
    uVar10._1_1_ = 'b';
    uVar10._2_1_ = 'l';
    uVar10._3_1_ = 'e';
    break;
  case 0xec:
    builtin_strncpy(errtext + 0xe," width of table",0x10);
    uVar3._0_1_ = 'c';
    uVar3._1_1_ = 'o';
    uVar3._2_1_ = 'l';
    uVar3._3_1_ = 'u';
    uVar5._0_1_ = 'm';
    uVar5._1_1_ = 'n';
    uVar5._2_1_ = ' ';
    uVar5._3_1_ = 'e';
    uVar8._0_1_ = 'x';
    uVar8._1_1_ = 'c';
    uVar8._2_1_ = 'e';
    uVar8._3_1_ = 'e';
    uVar10._0_1_ = 'd';
    uVar10._1_1_ = 's';
    uVar10._2_1_ = ' ';
    uVar10._3_1_ = 'w';
    break;
  case 0xed:
    builtin_strncpy(errtext + 0xf,"ching col. name",0x10);
    uVar3._0_1_ = 'm';
    uVar3._1_1_ = 'o';
    uVar3._2_1_ = 'r';
    uVar3._3_1_ = 'e';
    uVar5._0_1_ = ' ';
    uVar5._1_1_ = 't';
    uVar5._2_1_ = 'h';
    uVar5._3_1_ = 'a';
    uVar8._0_1_ = 'n';
    uVar8._1_1_ = ' ';
    uVar8._2_1_ = '1';
    uVar8._3_1_ = ' ';
    uVar10._0_1_ = 'm';
    uVar10._1_1_ = 'a';
    uVar10._2_1_ = 't';
    uVar10._3_1_ = 'c';
    break;
  case 0xf1:
    builtin_strncpy(errtext + 0xd," = field widths",0x10);
    uVar3._0_1_ = 'r';
    uVar3._1_1_ = 'o';
    uVar3._2_1_ = 'w';
    uVar3._3_1_ = ' ';
    uVar5._0_1_ = 'w';
    uVar5._1_1_ = 'i';
    uVar5._2_1_ = 'd';
    uVar5._3_1_ = 't';
    uVar8._0_1_ = 'h';
    uVar8._1_1_ = ' ';
    uVar8._2_1_ = 'n';
    uVar8._3_1_ = 'o';
    uVar10._0_1_ = 't';
    uVar10._1_1_ = ' ';
    uVar10._2_1_ = '=';
    uVar10._3_1_ = ' ';
    break;
  case 0xfb:
    builtin_strncpy(errtext + 0xc," extension type",0x10);
    uVar3._0_1_ = 'u';
    uVar3._1_1_ = 'n';
    uVar3._2_1_ = 'k';
    uVar3._3_1_ = 'n';
    uVar5._0_1_ = 'o';
    uVar5._1_1_ = 'w';
    uVar5._2_1_ = 'n';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 'F';
    uVar8._1_1_ = 'I';
    uVar8._2_1_ = 'T';
    uVar8._3_1_ = 'S';
    uVar10._0_1_ = ' ';
    uVar10._1_1_ = 'e';
    uVar10._2_1_ = 'x';
    uVar10._3_1_ = 't';
    break;
  case 0xfc:
    builtin_strncpy(errtext + 0xf,"PLE or XTENSION",0x10);
    uVar3._0_1_ = '1';
    uVar3._1_1_ = 's';
    uVar3._2_1_ = 't';
    uVar3._3_1_ = ' ';
    uVar5._0_1_ = 'k';
    uVar5._1_1_ = 'e';
    uVar5._2_1_ = 'y';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 'n';
    uVar8._1_1_ = 'o';
    uVar8._2_1_ = 't';
    uVar8._3_1_ = ' ';
    uVar10._0_1_ = 'S';
    uVar10._1_1_ = 'I';
    uVar10._2_1_ = 'M';
    uVar10._3_1_ = 'P';
    break;
  case 0xfd:
    builtin_strncpy(errtext + 9,"rd is not blank",0x10);
    uVar3._0_1_ = 'E';
    uVar3._1_1_ = 'N';
    uVar3._2_1_ = 'D';
    uVar3._3_1_ = ' ';
    uVar5._0_1_ = 'k';
    uVar5._1_1_ = 'e';
    uVar5._2_1_ = 'y';
    uVar5._3_1_ = 'w';
    uVar8._0_1_ = 'o';
    uVar8._1_1_ = 'r';
    uVar8._2_1_ = 'd';
    uVar8._3_1_ = ' ';
    uVar10._0_1_ = 'i';
    uVar10._1_1_ = 's';
    uVar10._2_1_ = ' ';
    uVar10._3_1_ = 'n';
    break;
  case 0xfe:
    builtin_strncpy(errtext + 0xb," area not blank",0x10);
    uVar3._0_1_ = 'H';
    uVar3._1_1_ = 'e';
    uVar3._2_1_ = 'a';
    uVar3._3_1_ = 'd';
    uVar5._0_1_ = 'e';
    uVar5._1_1_ = 'r';
    uVar5._2_1_ = ' ';
    uVar5._3_1_ = 'f';
    uVar8._0_1_ = 'i';
    uVar8._1_1_ = 'l';
    uVar8._2_1_ = 'l';
    uVar8._3_1_ = ' ';
    uVar10._0_1_ = 'a';
    uVar10._1_1_ = 'r';
    uVar10._2_1_ = 'e';
    uVar10._3_1_ = 'a';
    break;
  case 0xff:
    builtin_strncpy(errtext,"Data fill area i",0x10);
    uVar1 = 0x64696c61766e69;
    goto LAB_0017bb46;
  case 0x105:
    builtin_strncpy(errtext + 10,"ORM format code",0x10);
    uVar3._0_1_ = 'i';
    uVar3._1_1_ = 'l';
    uVar3._2_1_ = 'l';
    uVar3._3_1_ = 'e';
    uVar5._0_1_ = 'g';
    uVar5._1_1_ = 'a';
    uVar5._2_1_ = 'l';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 'T';
    uVar8._1_1_ = 'F';
    uVar8._2_1_ = 'O';
    uVar8._3_1_ = 'R';
    uVar10._0_1_ = 'M';
    uVar10._1_1_ = ' ';
    uVar10._2_1_ = 'f';
    uVar10._3_1_ = 'o';
    break;
  case 0x106:
    builtin_strncpy(errtext + 0xc,"M datatype code",0x10);
    uVar3._0_1_ = 'u';
    uVar3._1_1_ = 'n';
    uVar3._2_1_ = 'k';
    uVar3._3_1_ = 'n';
    uVar5._0_1_ = 'o';
    uVar5._1_1_ = 'w';
    uVar5._2_1_ = 'n';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 'T';
    uVar8._1_1_ = 'F';
    uVar8._2_1_ = 'O';
    uVar8._3_1_ = 'R';
    uVar10._0_1_ = 'M';
    uVar10._1_1_ = ' ';
    uVar10._2_1_ = 'd';
    uVar10._3_1_ = 'a';
    break;
  case 0x107:
    builtin_strncpy(errtext + 0xc,"n keyword value",0x10);
    uVar3._0_1_ = 'i';
    uVar3._1_1_ = 'l';
    uVar3._2_1_ = 'l';
    uVar3._3_1_ = 'e';
    uVar5._0_1_ = 'g';
    uVar5._1_1_ = 'a';
    uVar5._2_1_ = 'l';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 'T';
    uVar8._1_1_ = 'D';
    uVar8._2_1_ = 'I';
    uVar8._3_1_ = 'M';
    uVar10._0_1_ = 'n';
    uVar10._1_1_ = ' ';
    uVar10._2_1_ = 'k';
    uVar10._3_1_ = 'e';
    break;
  case 0x108:
    builtin_strncpy(errtext + 0xe,"LE heap pointer",0x10);
    uVar3._0_1_ = 'i';
    uVar3._1_1_ = 'n';
    uVar3._2_1_ = 'v';
    uVar3._3_1_ = 'a';
    uVar5._0_1_ = 'l';
    uVar5._1_1_ = 'i';
    uVar5._2_1_ = 'd';
    uVar5._3_1_ = ' ';
    uVar8._0_1_ = 'B';
    uVar8._1_1_ = 'I';
    uVar8._2_1_ = 'N';
    uVar8._3_1_ = 'T';
    uVar10._0_1_ = 'A';
    uVar10._1_1_ = 'B';
    uVar10._2_1_ = 'L';
    uVar10._3_1_ = 'E';
    break;
  default:
    if (status == 1) {
      builtin_strncpy(errtext + 10,"O program error",0x10);
      uVar3._0_1_ = 'n';
      uVar3._1_1_ = 'o';
      uVar3._2_1_ = 'n';
      uVar3._3_1_ = '-';
      uVar5._0_1_ = 'C';
      uVar5._1_1_ = 'F';
      uVar5._2_1_ = 'I';
      uVar5._3_1_ = 'T';
      uVar8._0_1_ = 'S';
      uVar8._1_1_ = 'I';
      uVar8._2_1_ = 'O';
      uVar8._3_1_ = ' ';
      uVar10._0_1_ = 'p';
      uVar10._1_1_ = 'r';
      uVar10._2_1_ = 'o';
      uVar10._3_1_ = 'g';
      break;
    }
    if (status == 0) {
      builtin_strncpy(errtext + 6,"o error",8);
      uVar1 = 0x206f6e202d204b4f;
      goto LAB_0017b79e;
    }
    goto switchD_0017aeb1_caseD_66;
  }
LAB_0017bb5d:
  *(undefined4 *)errtext = uVar3;
  *(undefined4 *)(errtext + 4) = uVar5;
  *(undefined4 *)(errtext + 8) = uVar8;
  *(undefined4 *)(errtext + 0xc) = uVar10;
  return;
switchD_0017aeb1_caseD_66:
  builtin_strncpy(errtext,"unknown error st",0x10);
  uVar1 = 0x73757461747320;
LAB_0017af70:
  *(undefined8 *)(errtext + 0xd) = uVar1;
  return;
}

Assistant:

void ffgerr(int status,     /* I - error status value */
            char *errtext)  /* O - error message (max 30 char long + null) */
/*
  Return a short descriptive error message that corresponds to the input
  error status value.  The message may be up to 30 characters long, plus
  the terminating null character.
*/
{
  errtext[0] = '\0';

  if (status >= 0 && status < 300)
  {
    switch (status) {

    case 0:
       strcpy(errtext, "OK - no error");
       break;
    case 1:
       strcpy(errtext, "non-CFITSIO program error");
       break;
    case 101:
       strcpy(errtext, "same input and output files");
       break;
    case 103:
       strcpy(errtext, "attempt to open too many files");
       break;
    case 104:
       strcpy(errtext, "could not open the named file");
       break;
    case 105:
       strcpy(errtext, "couldn't create the named file");
       break;
    case 106:
       strcpy(errtext, "error writing to FITS file");
       break;
    case 107:
       strcpy(errtext, "tried to move past end of file");
       break;
    case 108:
       strcpy(errtext, "error reading from FITS file");
       break;
    case 110:
       strcpy(errtext, "could not close the file");
       break;
    case 111:
       strcpy(errtext, "array dimensions too big");
       break;
    case 112:
       strcpy(errtext, "cannot write to readonly file");
       break;
    case 113:
       strcpy(errtext, "could not allocate memory");
       break;
    case 114:
       strcpy(errtext, "invalid fitsfile pointer");
       break;
    case 115:
       strcpy(errtext, "NULL input pointer");
       break;
    case 116:
       strcpy(errtext, "error seeking file position");
       break;
    case 117:
       strcpy(errtext, "bad value for file download timeout setting");
       break;
    case 121:
       strcpy(errtext, "invalid URL prefix");
       break;
    case 122:
       strcpy(errtext, "too many I/O drivers");
       break;
    case 123:
       strcpy(errtext, "I/O driver init failed");
       break;
    case 124:
       strcpy(errtext, "no I/O driver for this URLtype");
       break;
    case 125:
       strcpy(errtext, "parse error in input file URL");
       break;
    case 126:
       strcpy(errtext, "parse error in range list");
       break;
    case 151:
       strcpy(errtext, "bad argument (shared mem drvr)");
       break;
    case 152:
       strcpy(errtext, "null ptr arg (shared mem drvr)");
       break;
    case 153:
       strcpy(errtext, "no free shared memory handles");
       break;
    case 154:
       strcpy(errtext, "share mem drvr not initialized");
       break;
    case 155:
       strcpy(errtext, "IPC system error (shared mem)");
       break;
    case 156:
       strcpy(errtext, "no memory (shared mem drvr)");
       break;
    case 157:
       strcpy(errtext, "share mem resource deadlock");
       break;
    case 158:
       strcpy(errtext, "lock file open/create failed");
       break;
    case 159:
       strcpy(errtext, "can't resize share mem block");
       break;
    case 201:
       strcpy(errtext, "header already has keywords");
       break;
    case 202:
       strcpy(errtext, "keyword not found in header");
       break;
    case 203:
       strcpy(errtext, "keyword number out of bounds");
       break;
    case 204:
       strcpy(errtext, "keyword value is undefined");
       break;
    case 205:
       strcpy(errtext, "string missing closing quote");
       break;
    case 206:
       strcpy(errtext, "error in indexed keyword name");
       break;
    case 207:
       strcpy(errtext, "illegal character in keyword");
       break;
    case 208:
       strcpy(errtext, "required keywords out of order");
       break;
    case 209:
       strcpy(errtext, "keyword value not positive int");
       break;
    case 210:
       strcpy(errtext, "END keyword not found");
       break;
    case 211:
       strcpy(errtext, "illegal BITPIX keyword value");
       break;
    case 212:
       strcpy(errtext, "illegal NAXIS keyword value");
       break;
    case 213:
       strcpy(errtext, "illegal NAXISn keyword value");
       break;
    case 214:
       strcpy(errtext, "illegal PCOUNT keyword value");
       break;
    case 215:
       strcpy(errtext, "illegal GCOUNT keyword value");
       break;
    case 216:
       strcpy(errtext, "illegal TFIELDS keyword value");
       break;
    case 217:
       strcpy(errtext, "negative table row size");
       break;
    case 218:
       strcpy(errtext, "negative number of rows");
       break;
    case 219:
       strcpy(errtext, "named column not found");
       break;
    case 220:
       strcpy(errtext, "illegal SIMPLE keyword value");
       break;
    case 221:
       strcpy(errtext, "first keyword not SIMPLE");
       break;
    case 222:
       strcpy(errtext, "second keyword not BITPIX");
       break;
    case 223:
       strcpy(errtext, "third keyword not NAXIS");
       break;
    case 224:
       strcpy(errtext, "missing NAXISn keywords");
       break;
    case 225:
       strcpy(errtext, "first keyword not XTENSION");
       break;
    case 226:
       strcpy(errtext, "CHDU not an ASCII table");
       break;
    case 227:
       strcpy(errtext, "CHDU not a binary table");
       break;
    case 228:
       strcpy(errtext, "PCOUNT keyword not found");
       break;
    case 229:
       strcpy(errtext, "GCOUNT keyword not found");
       break;
    case 230:
       strcpy(errtext, "TFIELDS keyword not found");
       break;
    case 231:
       strcpy(errtext, "missing TBCOLn keyword");
       break;
    case 232:
       strcpy(errtext, "missing TFORMn keyword");
       break;
    case 233:
       strcpy(errtext, "CHDU not an IMAGE extension");
       break;
    case 234:
       strcpy(errtext, "illegal TBCOLn keyword value");
       break;
    case 235:
       strcpy(errtext, "CHDU not a table extension");
       break;
    case 236:
       strcpy(errtext, "column exceeds width of table");
       break;
    case 237:
       strcpy(errtext, "more than 1 matching col. name");
       break;
    case 241:
       strcpy(errtext, "row width not = field widths");
       break;
    case 251:
       strcpy(errtext, "unknown FITS extension type");
       break;
    case 252:
       strcpy(errtext, "1st key not SIMPLE or XTENSION");
       break;
    case 253:
       strcpy(errtext, "END keyword is not blank");
       break;
    case 254:
       strcpy(errtext, "Header fill area not blank");
       break;
    case 255:
       strcpy(errtext, "Data fill area invalid");
       break;
    case 261:
       strcpy(errtext, "illegal TFORM format code");
       break;
    case 262:
       strcpy(errtext, "unknown TFORM datatype code");
       break;
    case 263:
       strcpy(errtext, "illegal TDIMn keyword value");
       break;
    case 264:
       strcpy(errtext, "invalid BINTABLE heap pointer");
       break;
    default:
       strcpy(errtext, "unknown error status");
       break;
    }
  }
  else if (status < 600)
  {
    switch(status) {

    case 301:
       strcpy(errtext, "illegal HDU number");
       break;
    case 302:
       strcpy(errtext, "column number < 1 or > tfields");
       break;
    case 304:
       strcpy(errtext, "negative byte address");
       break;
    case 306:
       strcpy(errtext, "negative number of elements");
       break;
    case 307:
       strcpy(errtext, "bad first row number");
       break;
    case 308:
       strcpy(errtext, "bad first element number");
       break;
    case 309:
       strcpy(errtext, "not an ASCII (A) column");
       break;
    case 310:
       strcpy(errtext, "not a logical (L) column");
       break;
    case 311:
       strcpy(errtext, "bad ASCII table datatype");
       break;
    case 312:
       strcpy(errtext, "bad binary table datatype");
       break;
    case 314:
       strcpy(errtext, "null value not defined");
       break;
    case 317:
       strcpy(errtext, "not a variable length column");
       break;
    case 320:
       strcpy(errtext, "illegal number of dimensions");
       break;
    case 321:
       strcpy(errtext, "1st pixel no. > last pixel no.");
       break;
    case 322:
       strcpy(errtext, "BSCALE or TSCALn = 0.");
       break;
    case 323:
       strcpy(errtext, "illegal axis length < 1");
       break;
    case 340:
       strcpy(errtext, "not group table");
       break;
    case 341:
       strcpy(errtext, "HDU already member of group");
       break;
    case 342:
       strcpy(errtext, "group member not found");
       break;
    case 343:
       strcpy(errtext, "group not found");
       break;
    case 344:
       strcpy(errtext, "bad group id");
       break;
    case 345:
       strcpy(errtext, "too many HDUs tracked");
       break;
    case 346:
       strcpy(errtext, "HDU alread tracked");
       break;
    case 347:
       strcpy(errtext, "bad Grouping option");
       break;
    case 348:
       strcpy(errtext, "identical pointers (groups)");
       break;
    case 360:
       strcpy(errtext, "malloc failed in parser");
       break;
    case 361:
       strcpy(errtext, "file read error in parser");
       break;
    case 362:
       strcpy(errtext, "null pointer arg (parser)");
       break;
    case 363:
       strcpy(errtext, "empty line (parser)");
       break;
    case 364:
       strcpy(errtext, "cannot unread > 1 line");
       break;
    case 365:
       strcpy(errtext, "parser too deeply nested");
       break;
    case 366:
       strcpy(errtext, "file open failed (parser)");
       break;
    case 367:
       strcpy(errtext, "hit EOF (parser)");
       break;
    case 368:
       strcpy(errtext, "bad argument (parser)");
       break;
    case 369:
       strcpy(errtext, "unexpected token (parser)");
       break;
    case 401:
       strcpy(errtext, "bad int to string conversion");
       break;
    case 402:
       strcpy(errtext, "bad float to string conversion");
       break;
    case 403:
       strcpy(errtext, "keyword value not integer");
       break;
    case 404:
       strcpy(errtext, "keyword value not logical");
       break;
    case 405:
       strcpy(errtext, "keyword value not floating pt");
       break;
    case 406:
       strcpy(errtext, "keyword value not double");
       break;
    case 407:
       strcpy(errtext, "bad string to int conversion");
       break;
    case 408:
       strcpy(errtext, "bad string to float conversion");
       break;
    case 409:
       strcpy(errtext, "bad string to double convert");
       break;
    case 410:
       strcpy(errtext, "illegal datatype code value");
       break;
    case 411:
       strcpy(errtext, "illegal no. of decimals");
       break;
    case 412:
       strcpy(errtext, "datatype conversion overflow");
       break;
    case 413:
       strcpy(errtext, "error compressing image");
       break;
    case 414:
       strcpy(errtext, "error uncompressing image");
       break;
    case 420:
       strcpy(errtext, "bad date or time conversion");
       break;
    case 431:
       strcpy(errtext, "syntax error in expression");
       break;
    case 432:
       strcpy(errtext, "expression result wrong type");
       break;
    case 433:
       strcpy(errtext, "vector result too large");
       break;
    case 434:
       strcpy(errtext, "missing output column");
       break;
    case 435:
       strcpy(errtext, "bad data in parsed column");
       break;
    case 436:
       strcpy(errtext, "output extension of wrong type");
       break;
    case 501:
       strcpy(errtext, "WCS angle too large");
       break;
    case 502:
       strcpy(errtext, "bad WCS coordinate");
       break;
    case 503:
       strcpy(errtext, "error in WCS calculation");
       break;
    case 504:
       strcpy(errtext, "bad WCS projection type");
       break;
    case 505:
       strcpy(errtext, "WCS keywords not found");
       break;
    default:
       strcpy(errtext, "unknown error status");
       break;
    }
  }
  else
  {
     strcpy(errtext, "unknown error status");
  }
  return;
}